

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<FunctionData_*,_128U>::~SmallArray(SmallArray<FunctionData_*,_128U> *this)

{
  FunctionData **ppFVar1;
  
  ppFVar1 = this->data;
  if (ppFVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppFVar1 != (FunctionData **)0x0) {
        (*(code *)NULLC::dealloc)(ppFVar1);
      }
    }
    else if (ppFVar1 != (FunctionData **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}